

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O3

Promise<kj::Own<kj::AsyncCapabilityStream,_std::nullptr_t>_> __thiscall
kj::AsyncCapabilityStream::receiveStream(AsyncCapabilityStream *this)

{
  PromiseArena *pPVar1;
  AsyncInputStream AVar2;
  AsyncOutputStream node;
  void *pvVar3;
  TransformPromiseNodeBase *this_00;
  AsyncCapabilityStream local_48;
  undefined1 local_38 [24];
  
  tryReceiveStream(&local_48);
  AVar2._vptr_AsyncInputStream =
       local_48.super_AsyncIoStream.super_AsyncInputStream._vptr_AsyncInputStream;
  pPVar1 = (PromiseArena *)
           local_48.super_AsyncIoStream.super_AsyncInputStream._vptr_AsyncInputStream[1];
  if (pPVar1 == (PromiseArena *)0x0 ||
      (ulong)((long)local_48.super_AsyncIoStream.super_AsyncInputStream._vptr_AsyncInputStream -
             (long)pPVar1) < 0x28) {
    pvVar3 = operator_new(0x400);
    this_00 = (TransformPromiseNodeBase *)((long)pvVar3 + 0x3d8);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,(OwnPromiseNode *)&local_48,
               kj::_::
               SimpleTransformPromiseNode<kj::Maybe<kj::Own<kj::AsyncCapabilityStream,_std::nullptr_t>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:2590:13)>
               ::anon_class_1_0_00000001_for_func::operator());
    *(undefined ***)((long)pvVar3 + 0x3d8) = &PTR_destroy_00623e28;
    *(void **)((long)pvVar3 + 0x3e0) = pvVar3;
  }
  else {
    local_48.super_AsyncIoStream.super_AsyncInputStream._vptr_AsyncInputStream[1] = (_func_int *)0x0
    ;
    this_00 = (TransformPromiseNodeBase *)
              (local_48.super_AsyncIoStream.super_AsyncInputStream._vptr_AsyncInputStream + -5);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,(OwnPromiseNode *)&local_48,
               kj::_::
               SimpleTransformPromiseNode<kj::Maybe<kj::Own<kj::AsyncCapabilityStream,_std::nullptr_t>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:2590:13)>
               ::anon_class_1_0_00000001_for_func::operator());
    AVar2._vptr_AsyncInputStream[-5] = (_func_int *)&PTR_destroy_00623e28;
    ((PromiseArenaMember *)(AVar2._vptr_AsyncInputStream + -4))->_vptr_PromiseArenaMember =
         (_func_int **)pPVar1;
  }
  local_38._0_8_ = &DAT_0048a171;
  local_38._8_8_ = &DAT_0048a1d0;
  local_38._16_8_ = &DAT_4c0000058b;
  local_48.super_AsyncIoStream.super_AsyncOutputStream._vptr_AsyncOutputStream =
       (_func_int **)this_00;
  kj::_::PromiseDisposer::
  appendPromise<kj::_::ChainPromiseNode,kj::_::PromiseDisposer,kj::SourceLocation&>
            ((PromiseDisposer *)this,
             (OwnPromiseNode *)&local_48.super_AsyncIoStream.super_AsyncOutputStream,
             (SourceLocation *)local_38);
  node._vptr_AsyncOutputStream =
       local_48.super_AsyncIoStream.super_AsyncOutputStream._vptr_AsyncOutputStream;
  if ((TransformPromiseNodeBase *)
      local_48.super_AsyncIoStream.super_AsyncOutputStream._vptr_AsyncOutputStream !=
      (TransformPromiseNodeBase *)0x0) {
    local_48.super_AsyncIoStream.super_AsyncOutputStream._vptr_AsyncOutputStream = (_func_int **)0x0
    ;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node._vptr_AsyncOutputStream);
  }
  AVar2._vptr_AsyncInputStream =
       local_48.super_AsyncIoStream.super_AsyncInputStream._vptr_AsyncInputStream;
  if ((PromiseArenaMember *)
      local_48.super_AsyncIoStream.super_AsyncInputStream._vptr_AsyncInputStream !=
      (PromiseArenaMember *)0x0) {
    local_48.super_AsyncIoStream.super_AsyncInputStream._vptr_AsyncInputStream = (_func_int **)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)AVar2._vptr_AsyncInputStream);
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<Own<AsyncCapabilityStream>> AsyncCapabilityStream::receiveStream() {
  return tryReceiveStream()
      .then([](Maybe<Own<AsyncCapabilityStream>>&& result)
            -> Promise<Own<AsyncCapabilityStream>> {
    KJ_IF_SOME(r, result) {
      return kj::mv(r);
    } else {
      return KJ_EXCEPTION(FAILED, "EOF when expecting to receive capability");
    }
  });
}